

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_bsp.cpp
# Opt level: O0

void AddPolyobjs(subsector_t *sub)

{
  uint uVar1;
  seg_t *psVar2;
  subsector_t *sub_00;
  node_t *node;
  uint local_14;
  uint i;
  subsector_t *sub_local;
  
  if ((sub->BSP == (FMiniBSP *)0x0) || ((sub->BSP->bDirty & 1U) != 0)) {
    subsector_t::BuildPolyBSP(sub);
    for (local_14 = 0; uVar1 = TArray<seg_t,_seg_t>::Size(&sub->BSP->Segs), local_14 < uVar1;
        local_14 = local_14 + 1) {
      psVar2 = TArray<seg_t,_seg_t>::operator[](&sub->BSP->Segs,(ulong)local_14);
      psVar2->Subsector = sub;
      psVar2 = TArray<seg_t,_seg_t>::operator[](&sub->BSP->Segs,(ulong)local_14);
      psVar2->PartnerSeg = (seg_t *)0x0;
    }
  }
  uVar1 = TArray<node_t,_node_t>::Size(&sub->BSP->Nodes);
  if (uVar1 == 0) {
    sub_00 = TArray<subsector_t,_subsector_t>::operator[](&sub->BSP->Subsectors,0);
    PolySubsector(sub_00);
  }
  else {
    node = TArray<node_t,_node_t>::Last(&sub->BSP->Nodes);
    RenderPolyBSPNode(node);
  }
  return;
}

Assistant:

static void AddPolyobjs(subsector_t *sub)
{
	if (sub->BSP == NULL || sub->BSP->bDirty)
	{
		sub->BuildPolyBSP();
		for (unsigned i = 0; i < sub->BSP->Segs.Size(); i++)
		{
			sub->BSP->Segs[i].Subsector = sub;
			sub->BSP->Segs[i].PartnerSeg = NULL;
		}
	}
	if (sub->BSP->Nodes.Size() == 0)
	{
		PolySubsector(&sub->BSP->Subsectors[0]);
	}
	else
	{
		RenderPolyBSPNode(&sub->BSP->Nodes.Last());
	}
}